

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O2

InstId asmjit::_abi_1_10::x86::InstInternal::stringToInstId(Arch arch,char *s,size_t len)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *extraout_RDX;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char nameData [32];
  
  lVar11 = 0;
  if (s != (char *)0x0) {
    pcVar5 = (char *)len;
    if (len == 0xffffffffffffffff) {
      pcVar5 = (char *)strlen(s);
      len = (size_t)extraout_RDX;
    }
    if (((char *)0xffffffffffffffee < pcVar5 + -0x12) && (uVar4 = (int)*s - 0x61, uVar4 < 0x1a)) {
      uVar12 = (ulong)*(ushort *)(InstDB::instNameIndex + (ulong)uVar4 * 4);
      lVar11 = 0;
      if (uVar12 != 0) {
        uVar3 = *(ushort *)(InstDB::instNameIndex + (ulong)uVar4 * 4 + 2) - uVar12;
        while (uVar8 = uVar3, uVar8 != 0) {
          lVar11 = (uVar8 >> 1) + uVar12;
          pcVar6 = (char *)Support::decodeInstName
                                     (nameData,*(uint32_t *)
                                                (InstDB::_instNameIndexTable + lVar11 * 4),
                                      (char *)len);
          pcVar7 = pcVar6;
          if (pcVar5 <= pcVar6) {
            pcVar7 = pcVar5;
          }
          len = 0xffffffffffffffff;
          do {
            if (len - (long)pcVar7 == -1) {
              iVar9 = -1;
              len = (size_t)pcVar7;
              break;
            }
            pbVar1 = (byte *)(s + 1 + len);
            pbVar2 = (byte *)(nameData + 1 + len);
            len = len + 1;
            iVar9 = (uint)*pbVar1 - (uint)*pbVar2;
          } while (iVar9 == 0);
          iVar10 = (int)pcVar5 - (int)pcVar6;
          if (len < pcVar7) {
            iVar10 = iVar9;
          }
          uVar3 = uVar8 >> 1;
          if (-1 < iVar10) {
            if (iVar10 == 0) goto LAB_0013dd95;
            uVar12 = lVar11 + 1;
            uVar3 = uVar8 - 1 >> 1;
          }
        }
        lVar11 = 0;
      }
    }
  }
LAB_0013dd95:
  return (InstId)lVar11;
}

Assistant:

InstId InstInternal::stringToInstId(Arch arch, const char* s, size_t len) noexcept {
  DebugUtils::unused(arch);

  if (ASMJIT_UNLIKELY(!s))
    return Inst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > InstDB::kMaxNameSize))
    return Inst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  size_t base = InstDB::instNameIndex[prefix].start;
  size_t end = InstDB::instNameIndex[prefix].end;

  if (ASMJIT_UNLIKELY(!base))
    return Inst::kIdNone;

  char nameData[32];
  for (size_t lim = end - base; lim != 0; lim >>= 1) {
    size_t instId = base + (lim >> 1);
    size_t nameSize = Support::decodeInstName(nameData, InstDB::_instNameIndexTable[instId], InstDB::_instNameStringTable);

    int result = Support::compareStringViews(s, len, nameData, nameSize);
    if (result < 0)
      continue;

    if (result > 0) {
      base = instId + 1;
      lim--;
      continue;
    }

    return InstId(instId);
  }

  return Inst::kIdNone;
}